

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunnonlinsol_newton.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  int iVar3;
  undefined8 *__ptr;
  long *flagvalue;
  void *pvVar4;
  long *flagvalue_00;
  long *flagvalue_01;
  int iVar5;
  char *__s;
  int local_44;
  SUNContext sunctx;
  long niters;
  
  local_44 = SUNContext_Create(0,&sunctx);
  iVar5 = 1;
  iVar3 = check_retval(&local_44,"SUNContext_Create",1);
  if (iVar3 == 0) {
    __ptr = (undefined8 *)malloc(0x38);
    flagvalue = (long *)N_VNew_Serial(3,sunctx);
    *__ptr = flagvalue;
    iVar3 = check_retval(flagvalue,"N_VNew_Serial",0);
    if (iVar3 == 0) {
      pvVar4 = (void *)N_VClone(flagvalue);
      __ptr[1] = pvVar4;
      iVar3 = check_retval(pvVar4,"N_VClone",0);
      if (iVar3 == 0) {
        flagvalue_00 = (long *)N_VClone(flagvalue);
        __ptr[2] = flagvalue_00;
        iVar3 = check_retval(flagvalue_00,"N_VClone",0);
        if (iVar3 == 0) {
          flagvalue_01 = (long *)N_VClone(flagvalue);
          __ptr[3] = flagvalue_01;
          iVar3 = check_retval(flagvalue_01,"N_VClone",0);
          if (iVar3 == 0) {
            pvVar4 = (void *)N_VClone(flagvalue);
            __ptr[4] = pvVar4;
            iVar3 = check_retval(pvVar4,"N_VClone",0);
            if (iVar3 == 0) {
              puVar1 = *(undefined8 **)(*flagvalue + 0x10);
              *puVar1 = 0x3fe0000000000000;
              puVar1[1] = 0x3fe0000000000000;
              puVar1[2] = 0x3fe0000000000000;
              puVar1 = *(undefined8 **)(*flagvalue_00 + 0x10);
              puVar1[2] = 0;
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar2 = *(undefined4 **)(*flagvalue_01 + 0x10);
              *puVar2 = 0;
              puVar2[1] = 0x3ff00000;
              puVar2[2] = 0;
              puVar2[3] = 0x3ff00000;
              *(undefined8 *)(puVar2 + 4) = 0x3ff0000000000000;
              pvVar4 = (void *)SUNDenseMatrix(3,3,sunctx);
              __ptr[5] = pvVar4;
              iVar3 = check_retval(pvVar4,"SUNDenseMatrix",0);
              if (iVar3 == 0) {
                pvVar4 = (void *)SUNLinSol_Dense(flagvalue,pvVar4,sunctx);
                __ptr[6] = pvVar4;
                iVar3 = check_retval(pvVar4,"SUNLinSol_Dense",0);
                if (iVar3 == 0) {
                  local_44 = SUNLinSolInitialize(pvVar4);
                  iVar3 = check_retval(&local_44,"SUNLinSolInitialize",1);
                  iVar5 = 1;
                  if (iVar3 == 0) {
                    pvVar4 = (void *)SUNNonlinSol_Newton(flagvalue,sunctx);
                    iVar3 = check_retval(pvVar4,"SUNNonlinSol_Newton",0);
                    if (iVar3 == 0) {
                      local_44 = SUNNonlinSolSetSysFn(pvVar4,Res);
                      iVar3 = check_retval(&local_44,"SUNNonlinSolSetSysFn",1);
                      iVar5 = 1;
                      if (iVar3 == 0) {
                        local_44 = SUNNonlinSolSetLSetupFn(pvVar4,LSetup);
                        iVar3 = check_retval(&local_44,"SUNNonlinSolSetSetupFn",1);
                        iVar5 = 1;
                        if (iVar3 == 0) {
                          local_44 = SUNNonlinSolSetLSolveFn(pvVar4,LSolve);
                          iVar3 = check_retval(&local_44,"SUNNonlinSolSetSolveFn",1);
                          iVar5 = 1;
                          if (iVar3 == 0) {
                            local_44 = SUNNonlinSolSetConvTestFn(pvVar4,ConvTest,0);
                            iVar3 = check_retval(&local_44,"SUNNonlinSolSetConvTestFn",1);
                            iVar5 = 1;
                            if (iVar3 == 0) {
                              local_44 = SUNNonlinSolSetMaxIters(pvVar4,10);
                              iVar3 = check_retval(&local_44,"SUNNonlinSolSetMaxIters",1);
                              iVar5 = 1;
                              if (iVar3 == 0) {
                                local_44 = SUNNonlinSolSolve(0x47ae147b,pvVar4,flagvalue,
                                                             flagvalue_00,flagvalue_01,1,__ptr);
                                iVar3 = check_retval(&local_44,"SUNNonlinSolSolve",1);
                                iVar5 = 1;
                                if (iVar3 == 0) {
                                  N_VLinearSum(0,0,*__ptr,__ptr[2],__ptr[1]);
                                  puts("Solution:");
                                  printf("y1 = %g\n",
                                         (int)**(undefined8 **)(*(long *)__ptr[1] + 0x10));
                                  printf("y2 = %g\n",
                                         (int)*(undefined8 *)
                                               (*(long *)(*(long *)__ptr[1] + 0x10) + 8));
                                  printf("y3 = %g\n",
                                         (int)*(undefined8 *)
                                               (*(long *)(*(long *)__ptr[1] + 0x10) + 0x10));
                                  puts("Solution Error:");
                                  printf("e1 = %g\n",
                                         SUB84(**(double **)(*(long *)__ptr[1] + 0x10) +
                                               -0.7851969330623553,0));
                                  printf("e2 = %g\n",
                                         SUB84(*(double *)(*(long *)(*(long *)__ptr[1] + 0x10) + 8)
                                               + -0.4966113929446564,0));
                                  printf("e3 = %g\n",
                                         SUB84(*(double *)
                                                (*(long *)(*(long *)__ptr[1] + 0x10) + 0x10) +
                                               -0.36992283074587234,0));
                                  local_44 = SUNNonlinSolGetNumIters(pvVar4,&niters);
                                  iVar3 = check_retval(&local_44,"SUNNonlinSolGetNumIters",1);
                                  iVar5 = 1;
                                  if (iVar3 == 0) {
                                    printf("Number of nonlinear iterations: %ld\n",niters);
                                    N_VDestroy(*__ptr);
                                    N_VDestroy(__ptr[1]);
                                    N_VDestroy(__ptr[2]);
                                    N_VDestroy(__ptr[3]);
                                    N_VDestroy(__ptr[4]);
                                    SUNMatDestroy(__ptr[5]);
                                    SUNLinSolFree(__ptr[6]);
                                    SUNNonlinSolFree(pvVar4);
                                    free(__ptr);
                                    SUNContext_Free(&sunctx);
                                    __s = "FAIL";
                                    if (local_44 == 0) {
                                      __s = "SUCCESS";
                                    }
                                    puts(__s);
                                    iVar5 = local_44;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int main(int argc, char* argv[])
{
  IntegratorMem Imem;     /* proxy for integrator memory */
  SUNNonlinearSolver NLS; /* nonlinear solver object     */
  long int niters;        /* number of nonlinear iters   */
  int retval = 0;         /* return value                */
  SUNContext sunctx;

  /* create SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* create proxy for integrator memory */
  Imem = (IntegratorMem)malloc(sizeof(struct IntegratorMemRec));

  /* create vector */
  Imem->y0 = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)Imem->y0, "N_VNew_Serial", 0)) { return (1); }

  Imem->ycur = N_VClone(Imem->y0);
  if (check_retval((void*)Imem->ycur, "N_VClone", 0)) { return (1); }

  Imem->ycor = N_VClone(Imem->y0);
  if (check_retval((void*)Imem->ycor, "N_VClone", 0)) { return (1); }

  Imem->w = N_VClone(Imem->y0);
  if (check_retval((void*)Imem->w, "N_VClone", 0)) { return (1); }

  Imem->x = N_VClone(Imem->y0);
  if (check_retval((void*)Imem->x, "N_VClone", 0)) { return (1); }

  /* set initial guess for the state */
  NV_Ith_S(Imem->y0, 0) = HALF;
  NV_Ith_S(Imem->y0, 1) = HALF;
  NV_Ith_S(Imem->y0, 2) = HALF;

  /* set initial guess for the correction */
  NV_Ith_S(Imem->ycor, 0) = ZERO;
  NV_Ith_S(Imem->ycor, 1) = ZERO;
  NV_Ith_S(Imem->ycor, 2) = ZERO;

  /* set weights for norm */
  NV_Ith_S(Imem->w, 0) = ONE;
  NV_Ith_S(Imem->w, 1) = ONE;
  NV_Ith_S(Imem->w, 2) = ONE;

  /* create dense matrix */
  Imem->A = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)Imem->A, "SUNDenseMatrix", 0)) { return (1); }

  /* create dense linear solver */
  Imem->LS = SUNLinSol_Dense(Imem->y0, Imem->A, sunctx);
  if (check_retval((void*)Imem->LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* initialize the linear solver */
  retval = SUNLinSolInitialize(Imem->LS);
  if (check_retval(&retval, "SUNLinSolInitialize", 1)) { return (1); }

  /* create nonlinear solver */
  NLS = SUNNonlinSol_Newton(Imem->y0, sunctx);
  if (check_retval((void*)NLS, "SUNNonlinSol_Newton", 0)) { return (1); }

  /* set the nonlinear residual function */
  retval = SUNNonlinSolSetSysFn(NLS, Res);
  if (check_retval(&retval, "SUNNonlinSolSetSysFn", 1)) { return (1); }

  /* set the wrapper functions to linear solver setup and solve functions */
  retval = SUNNonlinSolSetLSetupFn(NLS, LSetup);
  if (check_retval(&retval, "SUNNonlinSolSetSetupFn", 1)) { return (1); }

  retval = SUNNonlinSolSetLSolveFn(NLS, LSolve);
  if (check_retval(&retval, "SUNNonlinSolSetSolveFn", 1)) { return (1); }

  retval = SUNNonlinSolSetConvTestFn(NLS, ConvTest, NULL);
  if (check_retval(&retval, "SUNNonlinSolSetConvTestFn", 1)) { return (1); }

  /* set the maximum number of nonlinear iterations */
  retval = SUNNonlinSolSetMaxIters(NLS, MAXIT);
  if (check_retval(&retval, "SUNNonlinSolSetMaxIters", 1)) { return (1); }

  /* solve the nonlinear system */
  retval = SUNNonlinSolSolve(NLS, Imem->y0, Imem->ycor, Imem->w, TOL, SUNTRUE,
                             Imem);
  if (check_retval(&retval, "SUNNonlinSolSolve", 1)) { return (1); }

  /* update the initial guess with the final correction */
  N_VLinearSum(ONE, Imem->y0, ONE, Imem->ycor, Imem->ycur);

  /* print the solution */
  printf("Solution:\n");
  printf("y1 = %" GSYM "\n", NV_Ith_S(Imem->ycur, 0));
  printf("y2 = %" GSYM "\n", NV_Ith_S(Imem->ycur, 1));
  printf("y3 = %" GSYM "\n", NV_Ith_S(Imem->ycur, 2));

  /* print the solution error */
  printf("Solution Error:\n");
  printf("e1 = %" GSYM "\n", NV_Ith_S(Imem->ycur, 0) - Y1);
  printf("e2 = %" GSYM "\n", NV_Ith_S(Imem->ycur, 1) - Y2);
  printf("e3 = %" GSYM "\n", NV_Ith_S(Imem->ycur, 2) - Y3);

  /* get the number of linear iterations */
  retval = SUNNonlinSolGetNumIters(NLS, &niters);
  if (check_retval(&retval, "SUNNonlinSolGetNumIters", 1)) { return (1); }

  printf("Number of nonlinear iterations: %ld\n", niters);

  /* Free vector, matrix, linear solver, and nonlinear solver */
  N_VDestroy(Imem->y0);
  N_VDestroy(Imem->ycur);
  N_VDestroy(Imem->ycor);
  N_VDestroy(Imem->w);
  N_VDestroy(Imem->x);
  SUNMatDestroy(Imem->A);
  SUNLinSolFree(Imem->LS);
  SUNNonlinSolFree(NLS);
  free(Imem);
  SUNContext_Free(&sunctx);

  /* Print result */
  if (retval) { printf("FAIL\n"); }
  else { printf("SUCCESS\n"); }

  return (retval);
}